

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  long lVar4;
  _Alloc_hider __s1;
  size_type __n;
  _Alloc_hider a;
  _Alloc_hider __s1_00;
  size_type sVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  string *psVar12;
  DIR *__dirp;
  dirent *pdVar13;
  ulong uVar14;
  long *plVar15;
  PerExpandData *pPVar16;
  undefined8 extraout_RAX;
  size_type *psVar17;
  ulong *puVar18;
  ExpandEmitter *pEVar19;
  pointer pTVar20;
  pointer pTVar21;
  uint uVar22;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  string *psVar23;
  string *psVar24;
  char *pcVar25;
  pointer pbVar26;
  pointer pbVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  string fname;
  string stroutput_none;
  string stroutput_ws;
  vector<Testdata,_std::allocator<Testdata>_> testdata;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  string stroutput_strnone;
  string stroutput_strws;
  string rootdir;
  string local_1f0;
  PerExpandData *local_1d0;
  Testdata local_1c8;
  string local_158;
  ExpandEmitter *local_138;
  undefined **local_130;
  Testdata *local_128;
  pointer local_120;
  vector<Testdata,_std::allocator<Testdata>_> local_118;
  undefined1 local_f8 [32];
  ExpandEmitter *local_d8;
  ExpandEmitter *local_d0;
  ExpandEmitter *local_c8;
  PerExpandData *local_c0;
  string *local_b8;
  undefined1 local_b0 [16];
  TemplateModifier *local_a0;
  string *local_98;
  TemplateModifier local_90 [16];
  ExpandEmitter *local_80;
  ExpandEmitter *local_78;
  string *local_70;
  pointer local_68;
  string *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar10 = getenv("TEMPLATE_ROOTDIR");
  pcVar25 = ".";
  if (pcVar10 != (char *)0x0) {
    pcVar25 = pcVar10;
  }
  local_1c8.input_template_name._M_dataplus._M_p = (pointer)&local_1c8.input_template_name.field_2;
  sVar11 = strlen(pcVar25);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar25,pcVar25 + sVar11);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"src","");
  ctemplate::PathJoin((string *)local_50,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.input_template_name._M_dataplus._M_p != &local_1c8.input_template_name.field_2) {
    operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"tests","");
  ctemplate::PathJoin((string *)&local_1c8,(string *)local_50);
  std::__cxx11::string::operator=((string *)local_50,(string *)&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.input_template_name._M_dataplus._M_p != &local_1c8.input_template_name.field_2) {
    operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  psVar12 = (string *)ctemplate::mutable_default_template_cache();
  ctemplate::TemplateCache::SetTemplateRootDirectory(psVar12);
  ctemplate::default_template_cache();
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_f8._0_8_ = (string *)0x0;
  local_f8._8_8_ = (string *)0x0;
  local_1d0 = local_c0;
  __dirp = opendir((char *)local_c0);
  if (__dirp == (DIR *)0x0) {
    main_cold_2();
  }
  else {
    pdVar13 = readdir(__dirp);
    if (pdVar13 != (dirent *)0x0) {
      do {
        pcVar25 = pdVar13->d_name;
        iVar9 = strncmp(pcVar25,"template_unittest_test",0x16);
        if (iVar9 == 0) {
          local_1c8.input_template_name._M_dataplus._M_p =
               (pointer)&local_1c8.input_template_name.field_2;
          sVar11 = strlen(pcVar25);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,pcVar25,pcVar25 + sVar11);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                     &local_1c8.input_template_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.input_template_name._M_dataplus._M_p !=
              &local_1c8.input_template_name.field_2) {
            operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
          }
        }
        pdVar13 = readdir(__dirp);
      } while (pdVar13 != (dirent *)0x0);
    }
    iVar9 = closedir(__dirp);
    uVar6 = local_f8._0_8_;
    if (iVar9 == 0) {
      if (local_f8._0_8_ != local_f8._8_8_) {
        uVar14 = (long)(local_f8._8_8_ - local_f8._0_8_) >> 5;
        lVar4 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_f8._0_8_,local_f8._8_8_,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (uVar6);
      }
      if (local_f8._0_8_ != local_f8._8_8_) {
        paVar1 = &local_1c8.input_template.field_2;
        psVar23 = (string *)local_f8._0_8_;
        do {
          std::__cxx11::string::string
                    ((string *)&local_158,(char *)local_1d0,(allocator *)&local_a0);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_158);
          local_1c8.input_template_name._M_dataplus._M_p =
               (pointer)&local_1c8.input_template_name.field_2;
          psVar17 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_1c8.input_template_name.field_2._M_allocated_capacity = *psVar17;
            local_1c8.input_template_name.field_2._8_8_ = plVar15[3];
          }
          else {
            local_1c8.input_template_name.field_2._M_allocated_capacity = *psVar17;
            local_1c8.input_template_name._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_1c8.input_template_name._M_string_length = plVar15[1];
          *plVar15 = (long)psVar17;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_1c8);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          puVar18 = (ulong *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar18) {
            local_1f0.field_2._M_allocated_capacity = *puVar18;
            local_1f0.field_2._8_8_ = plVar15[3];
          }
          else {
            local_1f0.field_2._M_allocated_capacity = *puVar18;
            local_1f0._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_1f0._M_string_length = plVar15[1];
          *plVar15 = (long)puVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.input_template_name._M_dataplus._M_p !=
              &local_1c8.input_template_name.field_2) {
            operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          paVar2 = &local_1c8.input_template_name.field_2;
          local_1c8.input_template_name._M_string_length = 3;
          local_1c8.input_template_name.field_2._M_allocated_capacity._0_4_ = 0x6e692e;
          local_1c8.input_template_name._M_dataplus._M_p = (pointer)paVar2;
          bVar7 = EndsWith(&local_1f0,&local_1c8.input_template_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8.input_template_name._M_dataplus._M_p != paVar2) {
            operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
          }
          if (bVar7) {
            local_1c8.input_template_name.field_2._8_8_ = 0;
            local_1c8.input_template.field_2._8_8_ = 0;
            local_1c8.input_template_name._M_dataplus._M_p =
                 (pointer)&local_1c8.input_template_name.field_2;
            local_1c8.input_template_name._M_string_length = 0;
            local_1c8.input_template_name.field_2._M_allocated_capacity = 0;
            local_1c8.input_template._M_string_length = 0;
            local_1c8.input_template.field_2._M_allocated_capacity = 0;
            local_1c8.annotated_output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1c8.annotated_output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1c8.output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1c8.annotated_output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1c8.output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1c8.output.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1c8.input_template._M_dataplus._M_p = (pointer)paVar1;
            std::vector<Testdata,_std::allocator<Testdata>_>::emplace_back<Testdata>
                      (&local_118,&local_1c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1c8.annotated_output);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1c8.output);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8.input_template._M_dataplus._M_p != paVar1) {
              operator_delete(local_1c8.input_template._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8.input_template_name._M_dataplus._M_p !=
                &local_1c8.input_template_name.field_2) {
              operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1));
            ReadToString(&local_1f0,
                         &local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].input_template);
            this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
          }
          else {
            paVar2 = &local_1c8.input_template_name.field_2;
            local_1c8.input_template_name._M_string_length = 4;
            local_1c8.input_template_name.field_2._M_allocated_capacity._0_5_ = 0x74756f2e;
            local_1c8.input_template_name._M_dataplus._M_p = (pointer)paVar2;
            bVar7 = EndsWith(&local_1f0,&local_1c8.input_template_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8.input_template_name._M_dataplus._M_p != paVar2) {
              operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
            }
            if (bVar7) {
              this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].output;
            }
            else {
              paVar2 = &local_1c8.input_template_name.field_2;
              local_1c8.input_template_name.field_2._M_allocated_capacity = 0x756f5f6f6e6e612e;
              local_1c8.input_template_name._M_string_length = 9;
              local_1c8.input_template_name.field_2._8_2_ = 0x74;
              local_1c8.input_template_name._M_dataplus._M_p = (pointer)paVar2;
              bVar7 = EndsWith(&local_1f0,&local_1c8.input_template_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8.input_template_name._M_dataplus._M_p != paVar2) {
                operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
              }
              if (!bVar7) {
                printf("%s: %d: ASSERT FAILED: %s\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                       ,199,"false");
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                              ,199,"vector<Testdata> ReadDataFiles(const char *)");
              }
              this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].annotated_output;
            }
          }
          if (this != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
            if (local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              printf("%s: %d: ASSERT FAILED: %s\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                     ,0xca,"!retval.empty()");
              if (local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                __assert_fail("!retval.empty()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                              ,0xca,"vector<Testdata> ReadDataFiles(const char *)");
              }
LAB_001059aa:
              exit(1);
            }
            sVar3 = local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].input_template_name._M_string_length;
            if (psVar23->_M_string_length <= sVar3 + 4) {
              printf("%s: %d: ASSERT FAILED: %s\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                     ,0xcb,"it->length() > retval.back().input_template_name.length() + 4");
              if (psVar23->_M_string_length <=
                  local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].input_template_name._M_string_length + 4) {
                __assert_fail("it->length() > retval.back().input_template_name.length() + 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                              ,0xcb,"vector<Testdata> ReadDataFiles(const char *)");
              }
              goto LAB_001059aa;
            }
            iVar9 = atoi((psVar23->_M_dataplus)._M_p + sVar3 + 2);
            if (iVar9 == 0) {
              printf("%s: %d: ASSERT FAILED: %s\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                     ,0xd0,"dictnum");
              __assert_fail("dictnum",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                            ,0xd0,"vector<Testdata> ReadDataFiles(const char *)");
            }
            while ((ulong)(*(long *)(this + 8) - *(long *)this >> 5) < (ulong)(long)iVar9) {
              paVar2 = &local_1c8.input_template_name.field_2;
              local_1c8.input_template_name._M_string_length = 0;
              local_1c8.input_template_name.field_2._M_allocated_capacity =
                   local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_1c8.input_template_name._M_dataplus._M_p = (pointer)paVar2;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(this,&local_1c8.input_template_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8.input_template_name._M_dataplus._M_p != paVar2) {
                operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
              }
            }
            ReadToString(&local_1f0,(string *)(*(long *)this + (long)iVar9 * 0x20 + -0x20));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          psVar23 = psVar23 + 1;
        } while (psVar23 != (string *)local_f8._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      if (local_c0 != (PerExpandData *)local_b0) {
        operator_delete(local_c0);
      }
      local_68 = local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pTVar20 = local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_118.super__Vector_base<Testdata,_std::allocator<Testdata>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar9 = 1;
        pcVar25 = "FATAL ERROR: No test files found for template_regtest";
      }
      else {
        do {
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template_name)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template_name)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_78 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate((TemplateString *)&local_1c8,DO_NOT_STRIP);
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template_name)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template_name)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_c8 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate
                               ((TemplateString *)&local_1c8,STRIP_BLANK_LINES);
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template_name)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template_name)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_80 = (ExpandEmitter *)
                     ctemplate::Template::GetTemplate((TemplateString *)&local_1c8,STRIP_WHITESPACE)
          ;
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_d8 = (ExpandEmitter *)
                     ctemplate::Template::StringToTemplate
                               ((TemplateString *)&local_1c8,DO_NOT_STRIP);
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_d0 = (ExpandEmitter *)
                     ctemplate::Template::StringToTemplate
                               ((TemplateString *)&local_1c8,STRIP_BLANK_LINES);
          local_1c8.input_template_name._M_dataplus._M_p =
               (pTVar20->input_template)._M_dataplus._M_p;
          local_1c8.input_template_name._M_string_length =
               (pTVar20->input_template)._M_string_length;
          local_1c8.input_template_name.field_2._M_allocated_capacity =
               local_1c8.input_template_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1c8.input_template_name.field_2._8_8_ = 0;
          local_138 = (ExpandEmitter *)
                      ctemplate::Template::StringToTemplate
                                ((TemplateString *)&local_1c8,STRIP_WHITESPACE);
          psVar23 = (pTVar20->output).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_120 = pTVar20;
          if (psVar23 !=
              (pTVar20->output).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar7 = local_78 == (ExpandEmitter *)0x0;
            bVar28 = local_c8 == (ExpandEmitter *)0x0;
            bVar29 = local_80 == (ExpandEmitter *)0x0;
            bVar30 = local_d8 == (ExpandEmitter *)0x0;
            bVar31 = local_d0 == (ExpandEmitter *)0x0;
            bVar32 = local_138 == (ExpandEmitter *)0x0;
            psVar24 = psVar23;
            do {
              local_70 = psVar24;
              if (psVar24->_M_string_length != 0) {
                uVar22 = (int)((ulong)((long)psVar23 -
                                      (long)(pTVar20->output).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + 1;
                local_58 = psVar23;
                printf("Testing template %s on dict #%d\n",
                       (pTVar20->input_template_name)._M_dataplus._M_p,(ulong)uVar22);
                if (bVar29 || (bVar28 || bVar7)) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x19d,"tpl_none && tpl_lines && tpl_ws");
                  __assert_fail("tpl_none && tpl_lines && tpl_ws",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x19d,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                if (bVar32 || (bVar31 || bVar30)) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x19e,"tplstr_none && tplstr_lines && tplstr_ws");
                  __assert_fail("tplstr_none && tplstr_lines && tplstr_ws",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x19e,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                local_1d0 = (PerExpandData *)MakeDictionary(uVar22);
                local_1c8.input_template_name._M_dataplus._M_p =
                     (pointer)&local_1c8.input_template_name.field_2;
                local_1c8.input_template_name._M_string_length = 0;
                local_1c8.input_template_name.field_2._M_allocated_capacity =
                     local_1c8.input_template_name.field_2._M_allocated_capacity &
                     0xffffffffffffff00;
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                local_1f0._M_string_length = 0;
                local_1f0.field_2._M_allocated_capacity =
                     local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_158._M_string_length = 0;
                local_158.field_2._M_local_buf[0] = '\0';
                local_b8 = (string *)0x0;
                local_b0[0] = 0;
                local_f8._8_8_ = (string *)0x0;
                local_f8._16_8_ = local_f8._16_8_ & 0xffffffffffffff00;
                local_a0 = local_90;
                local_98 = (string *)0x0;
                local_90[0] = (TemplateModifier)0x0;
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                local_128 = &local_1c8;
                local_f8._0_8_ = (string *)(local_f8 + 0x10);
                local_c0 = (PerExpandData *)local_b0;
                ctemplate::default_template_cache();
                pEVar19 = local_d0;
                ctemplate::Template::ExpandWithDataAndCache
                          (local_78,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_1f0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_c8,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_158;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_80,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_c0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_d8,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)local_f8;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (pEVar19,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                local_130 = &PTR__ExpandEmitter_0010cd20;
                local_128 = (Testdata *)&local_a0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_138,(TemplateDictionaryInterface *)&local_130,local_1d0,
                           (TemplateCache *)0x0);
                bVar8 = StringEq(local_70,&local_158,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                 ,0x1ad,"*out","stroutput_ws");
                sVar5 = local_158._M_string_length;
                sVar3 = local_1c8.input_template_name._M_string_length;
                if (!bVar8) {
                  __assert_fail("StringEq(*out, stroutput_ws, __FILE__, __LINE__, \"*out\", \"stroutput_ws\")"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                ,0x1ad,
                                "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                               );
                }
                if ((local_1c8.input_template_name._M_string_length == local_158._M_string_length)
                   && (((string *)local_1c8.input_template_name._M_string_length == (string *)0x0 ||
                       (iVar9 = bcmp(local_1c8.input_template_name._M_dataplus._M_p,
                                     local_158._M_dataplus._M_p,
                                     local_1c8.input_template_name._M_string_length), iVar9 == 0))))
                {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b2,"stroutput_none != stroutput_ws");
                  if ((local_1c8.input_template_name._M_string_length == local_158._M_string_length)
                     && (((string *)local_1c8.input_template_name._M_string_length == (string *)0x0
                         || (iVar9 = bcmp(local_1c8.input_template_name._M_dataplus._M_p,
                                          local_158._M_dataplus._M_p,
                                          local_1c8.input_template_name._M_string_length),
                            iVar9 == 0)))) {
                    __assert_fail("stroutput_none != stroutput_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b2,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                __n = local_1f0._M_string_length;
                if ((local_1f0._M_string_length == sVar5) &&
                   (((string *)local_1f0._M_string_length == (string *)0x0 ||
                    (iVar9 = bcmp(local_1f0._M_dataplus._M_p,local_158._M_dataplus._M_p,
                                  local_1f0._M_string_length), iVar9 == 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b3,"stroutput_lines != stroutput_ws");
                  if ((local_1f0._M_string_length == local_158._M_string_length) &&
                     (((string *)local_1f0._M_string_length == (string *)0x0 ||
                      (iVar9 = bcmp(local_1f0._M_dataplus._M_p,local_158._M_dataplus._M_p,
                                    local_1f0._M_string_length), iVar9 == 0)))) {
                    __assert_fail("stroutput_lines != stroutput_ws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b3,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                a._M_p = local_1c8.input_template_name._M_dataplus._M_p;
                __s1._M_p = local_1f0._M_dataplus._M_p;
                local_60 = (string *)sVar5;
                bVar8 = StreqExcept(local_1c8.input_template_name._M_dataplus._M_p,
                                    local_1f0._M_dataplus._M_p," \t\v\f\r\n");
                __s1_00._M_p = local_158._M_dataplus._M_p;
                if (!bVar8) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b5,
                         "StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                        );
                  bVar7 = StreqExcept(local_1c8.input_template_name._M_dataplus._M_p,
                                      local_1f0._M_dataplus._M_p," \t\v\f\r\n");
                  if (!bVar7) {
                    __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_lines.c_str(), \" \\t\\v\\f\\r\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b5,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                bVar8 = StreqExcept(a._M_p,local_158._M_dataplus._M_p," \t\v\f\r\n");
                if (!bVar8) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1b7,
                         "StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                        );
                  bVar7 = StreqExcept(local_1c8.input_template_name._M_dataplus._M_p,
                                      local_158._M_dataplus._M_p," \t\v\f\r\n");
                  if (!bVar7) {
                    __assert_fail("StreqExcept(stroutput_none.c_str(), stroutput_ws.c_str(), \" \\t\\v\\f\\r\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1b7,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                if (((string *)sVar3 != local_b8) ||
                   (((string *)sVar3 != (string *)0x0 &&
                    (iVar9 = bcmp(a._M_p,local_c0,sVar3), iVar9 != 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1ba,"stroutput_none == stroutput_strnone");
                  if (((string *)local_1c8.input_template_name._M_string_length != local_b8) ||
                     (((string *)local_1c8.input_template_name._M_string_length != (string *)0x0 &&
                      (iVar9 = bcmp(local_1c8.input_template_name._M_dataplus._M_p,local_c0,
                                    local_1c8.input_template_name._M_string_length), iVar9 != 0))))
                  {
                    __assert_fail("stroutput_none == stroutput_strnone",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1ba,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                if ((__n != local_f8._8_8_) ||
                   (((string *)__n != (string *)0x0 &&
                    (iVar9 = bcmp(__s1._M_p,(void *)local_f8._0_8_,__n), iVar9 != 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1bb,"stroutput_lines == stroutput_strlines");
                  if ((local_1f0._M_string_length != local_f8._8_8_) ||
                     (((string *)local_1f0._M_string_length != (string *)0x0 &&
                      (iVar9 = bcmp(local_1f0._M_dataplus._M_p,(void *)local_f8._0_8_,
                                    local_1f0._M_string_length), iVar9 != 0)))) {
                    __assert_fail("stroutput_lines == stroutput_strlines",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1bb,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                if ((local_60 != local_98) ||
                   ((local_60 != (string *)0x0 &&
                    (iVar9 = bcmp(__s1_00._M_p,local_a0,(size_t)local_60), iVar9 != 0)))) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1bc,"stroutput_ws == stroutput_strws");
                  if (((string *)local_158._M_string_length != local_98) ||
                     (((string *)local_158._M_string_length != (string *)0x0 &&
                      (iVar9 = bcmp(local_158._M_dataplus._M_p,local_a0,local_158._M_string_length),
                      iVar9 != 0)))) {
                    __assert_fail("stroutput_ws == stroutput_strws",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1bc,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                (**(code **)(local_1d0->annotate_path_ + 8))();
                if (local_a0 != local_90) {
                  operator_delete(local_a0);
                }
                psVar23 = local_58;
                if ((string *)local_f8._0_8_ != (string *)(local_f8 + 0x10)) {
                  operator_delete((void *)local_f8._0_8_);
                }
                if (local_c0 != (PerExpandData *)local_b0) {
                  operator_delete(local_c0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p);
                }
                pTVar20 = local_120;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8.input_template_name._M_dataplus._M_p !=
                    &local_1c8.input_template_name.field_2) {
                  operator_delete(local_1c8.input_template_name._M_dataplus._M_p);
                  pTVar20 = local_120;
                }
              }
              psVar24 = local_70 + 1;
              psVar23 = psVar23 + 1;
            } while (psVar24 !=
                     (pTVar20->output).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          pbVar26 = (pTVar20->annotated_output).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar19 = local_138;
          pbVar27 = pbVar26;
          if (pbVar26 !=
              (pTVar20->annotated_output).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              if (pbVar26->_M_string_length != 0) {
                uVar22 = (int)((ulong)((long)pbVar27 -
                                      (long)(pTVar20->annotated_output).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) + 1;
                printf("Testing template %s on dict #%d (annotated)\n",
                       (pTVar20->input_template_name)._M_dataplus._M_p,(ulong)uVar22);
                pPVar16 = (PerExpandData *)MakeDictionary(uVar22);
                local_1c8.input_template_name._M_string_length = 0;
                local_1c8.input_template_name.field_2._M_allocated_capacity = 0;
                local_1c8.input_template_name.field_2._8_8_ = 0;
                local_1c8.input_template_name._M_dataplus._M_p = "template_unittest_test";
                local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
                local_1f0._M_string_length = 0;
                local_1f0.field_2._M_allocated_capacity =
                     local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_158._M_dataplus._M_p = (pointer)&PTR__ExpandEmitter_0010cd20;
                local_158._M_string_length = (size_type)&local_1f0;
                ctemplate::default_template_cache();
                ctemplate::Template::ExpandWithDataAndCache
                          (local_c8,(TemplateDictionaryInterface *)&local_158,pPVar16,
                           (TemplateCache *)&local_1c8);
                bVar7 = StreqExcept((pbVar26->_M_dataplus)._M_p,local_1f0._M_dataplus._M_p,"\r\n");
                if (!bVar7) {
                  printf("%s: %d: ASSERT FAILED: %s\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                         ,0x1d2,"StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")");
                  bVar7 = StreqExcept((pbVar26->_M_dataplus)._M_p,local_1f0._M_dataplus._M_p,"\r\n")
                  ;
                  if (!bVar7) {
                    __assert_fail("StreqExcept(out->c_str(), output.c_str(), \"\\r\\n\")",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_regtest.cc"
                                  ,0x1d2,
                                  "void TestExpand(const vector<Testdata>::const_iterator &, const vector<Testdata>::const_iterator &)"
                                 );
                  }
                  goto LAB_001059aa;
                }
                (**(code **)(pPVar16->annotate_path_ + 8))(pPVar16);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                  operator_delete(local_1f0._M_dataplus._M_p);
                }
                ctemplate::PerExpandData::~PerExpandData((PerExpandData *)&local_1c8);
                pEVar19 = local_138;
                pTVar20 = local_120;
              }
              pbVar26 = pbVar26 + 1;
              pbVar27 = pbVar27 + 1;
            } while (pbVar26 !=
                     (pTVar20->annotated_output).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (local_d8 != (ExpandEmitter *)0x0) {
            (*local_d8->_vptr_ExpandEmitter[1])();
            pEVar19 = local_138;
            pTVar20 = local_120;
          }
          if (local_d0 != (ExpandEmitter *)0x0) {
            (*local_d0->_vptr_ExpandEmitter[1])();
            pEVar19 = local_138;
            pTVar20 = local_120;
          }
          pTVar21 = pTVar20;
          if (pEVar19 != (ExpandEmitter *)0x0) {
            (*pEVar19->_vptr_ExpandEmitter[1])(pEVar19);
            pTVar21 = local_120;
          }
          pTVar20 = pTVar21 + 1;
        } while (pTVar21 + 1 != local_68);
        iVar9 = 0;
        pcVar25 = "DONE";
      }
      puts(pcVar25);
      std::vector<Testdata,_std::allocator<Testdata>_>::~vector(&local_118);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      return iVar9;
    }
  }
  main_cold_1();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char** argv) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string rootdir = GOOGLE_NAMESPACE::PathJoin(template_rootdir, "src");
  rootdir = GOOGLE_NAMESPACE::PathJoin(rootdir, "tests");
  Template::SetTemplateRootDirectory(rootdir);

  vector<Testdata> testdata = ReadDataFiles(
      Template::template_root_directory().c_str());
  if (testdata.empty()) {
    printf("FATAL ERROR: No test files found for template_regtest\n");
    return 1;
  }

  TestExpand(testdata.begin(), testdata.end());

  printf("DONE\n");
  return 0;
}